

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_mtree_options(archive_write *a,char *key,char *value)

{
  long lVar1;
  int iVar2;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  int keybit;
  mtree_writer *mtree;
  uint local_2c;
  int local_4;
  
  lVar1 = *(long *)(in_RDI + 0xd0);
  local_2c = 0;
  switch(*in_RSI) {
  case 'a':
    iVar2 = strcmp(in_RSI,"all");
    if (iVar2 == 0) {
      local_2c = 0xffffffff;
    }
    break;
  case 'c':
    iVar2 = strcmp(in_RSI,"cksum");
    local_2c = (uint)(iVar2 == 0);
    break;
  case 'd':
    iVar2 = strcmp(in_RSI,"device");
    if (iVar2 == 0) {
      local_2c = 2;
    }
    else {
      iVar2 = strcmp(in_RSI,"dironly");
      if (iVar2 == 0) {
        *(uint *)(lVar1 + 0xf4) = (uint)(in_RDX != 0);
        return 0;
      }
    }
    break;
  case 'f':
    iVar2 = strcmp(in_RSI,"flags");
    if (iVar2 == 0) {
      local_2c = 8;
    }
    break;
  case 'g':
    iVar2 = strcmp(in_RSI,"gid");
    if (iVar2 == 0) {
      local_2c = 0x10;
    }
    else {
      iVar2 = strcmp(in_RSI,"gname");
      if (iVar2 == 0) {
        local_2c = 0x20;
      }
    }
    break;
  case 'i':
    iVar2 = strcmp(in_RSI,"indent");
    if (iVar2 == 0) {
      *(uint *)(lVar1 + 0xf8) = (uint)(in_RDX != 0);
      return 0;
    }
    iVar2 = strcmp(in_RSI,"inode");
    if (iVar2 == 0) {
      local_2c = 0x4000000;
    }
    break;
  case 'l':
    iVar2 = strcmp(in_RSI,"link");
    if (iVar2 == 0) {
      local_2c = 0x10000;
    }
    break;
  case 'm':
    iVar2 = strcmp(in_RSI,"md5");
    if ((iVar2 == 0) || (iVar2 = strcmp(in_RSI,"md5digest"), iVar2 == 0)) {
      local_2c = 0x100;
    }
    iVar2 = strcmp(in_RSI,"mode");
    if (iVar2 == 0) {
      local_2c = 0x200;
    }
    break;
  case 'n':
    iVar2 = strcmp(in_RSI,"nlink");
    if (iVar2 == 0) {
      local_2c = 0x400;
    }
    break;
  case 'r':
    iVar2 = strcmp(in_RSI,"resdevice");
    if (iVar2 == 0) {
      local_2c = 0x8000000;
    }
    else {
      iVar2 = strcmp(in_RSI,"ripemd160digest");
      if (((iVar2 == 0) || (iVar2 = strcmp(in_RSI,"rmd160"), iVar2 == 0)) ||
         (iVar2 = strcmp(in_RSI,"rmd160digest"), iVar2 == 0)) {
        local_2c = 0x2000;
      }
    }
    break;
  case 's':
    iVar2 = strcmp(in_RSI,"sha1");
    if ((iVar2 == 0) || (iVar2 = strcmp(in_RSI,"sha1digest"), iVar2 == 0)) {
      local_2c = 0x4000;
    }
    iVar2 = strcmp(in_RSI,"sha256");
    if ((iVar2 == 0) || (iVar2 = strcmp(in_RSI,"sha256digest"), iVar2 == 0)) {
      local_2c = 0x800000;
    }
    iVar2 = strcmp(in_RSI,"sha384");
    if ((iVar2 == 0) || (iVar2 = strcmp(in_RSI,"sha384digest"), iVar2 == 0)) {
      local_2c = 0x1000000;
    }
    iVar2 = strcmp(in_RSI,"sha512");
    if ((iVar2 == 0) || (iVar2 = strcmp(in_RSI,"sha512digest"), iVar2 == 0)) {
      local_2c = 0x2000000;
    }
    iVar2 = strcmp(in_RSI,"size");
    if (iVar2 == 0) {
      local_2c = 0x8000;
    }
    break;
  case 't':
    iVar2 = strcmp(in_RSI,"time");
    if (iVar2 == 0) {
      local_2c = 0x40000;
    }
    else {
      iVar2 = strcmp(in_RSI,"type");
      if (iVar2 == 0) {
        local_2c = 0x80000;
      }
    }
    break;
  case 'u':
    iVar2 = strcmp(in_RSI,"uid");
    if (iVar2 == 0) {
      local_2c = 0x100000;
    }
    else {
      iVar2 = strcmp(in_RSI,"uname");
      if (iVar2 == 0) {
        local_2c = 0x200000;
      }
      else {
        iVar2 = strcmp(in_RSI,"use-set");
        if (iVar2 == 0) {
          *(uint *)(lVar1 + 0xfc) = (uint)(in_RDX != 0);
          return 0;
        }
      }
    }
  }
  if (local_2c == 0) {
    local_4 = -0x14;
  }
  else {
    if (in_RDX == 0) {
      *(uint *)(lVar1 + 0xf0) = (local_2c ^ 0xffffffff) & *(uint *)(lVar1 + 0xf0);
    }
    else {
      *(uint *)(lVar1 + 0xf0) = local_2c | *(uint *)(lVar1 + 0xf0);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
archive_write_mtree_options(struct archive_write *a, const char *key,
    const char *value)
{
	struct mtree_writer *mtree= a->format_data;
	int keybit = 0;

	switch (key[0]) {
	case 'a':
		if (strcmp(key, "all") == 0)
			keybit = ~0;
		break;
	case 'c':
		if (strcmp(key, "cksum") == 0)
			keybit = F_CKSUM;
		break;
	case 'd':
		if (strcmp(key, "device") == 0)
			keybit = F_DEV;
		else if (strcmp(key, "dironly") == 0) {
			mtree->dironly = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		}
		break;
	case 'f':
		if (strcmp(key, "flags") == 0)
			keybit = F_FLAGS;
		break;
	case 'g':
		if (strcmp(key, "gid") == 0)
			keybit = F_GID;
		else if (strcmp(key, "gname") == 0)
			keybit = F_GNAME;
		break;
	case 'i':
		if (strcmp(key, "indent") == 0) {
			mtree->indent = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		} else if (strcmp(key, "inode") == 0) {
			keybit = F_INO;
		}
		break;
	case 'l':
		if (strcmp(key, "link") == 0)
			keybit = F_SLINK;
		break;
	case 'm':
		if (strcmp(key, "md5") == 0 ||
		    strcmp(key, "md5digest") == 0)
			keybit = F_MD5;
		if (strcmp(key, "mode") == 0)
			keybit = F_MODE;
		break;
	case 'n':
		if (strcmp(key, "nlink") == 0)
			keybit = F_NLINK;
		break;
	case 'r':
		if (strcmp(key, "resdevice") == 0) {
			keybit = F_RESDEV;
		} else if (strcmp(key, "ripemd160digest") == 0 ||
		    strcmp(key, "rmd160") == 0 ||
		    strcmp(key, "rmd160digest") == 0)
			keybit = F_RMD160;
		break;
	case 's':
		if (strcmp(key, "sha1") == 0 ||
		    strcmp(key, "sha1digest") == 0)
			keybit = F_SHA1;
		if (strcmp(key, "sha256") == 0 ||
		    strcmp(key, "sha256digest") == 0)
			keybit = F_SHA256;
		if (strcmp(key, "sha384") == 0 ||
		    strcmp(key, "sha384digest") == 0)
			keybit = F_SHA384;
		if (strcmp(key, "sha512") == 0 ||
		    strcmp(key, "sha512digest") == 0)
			keybit = F_SHA512;
		if (strcmp(key, "size") == 0)
			keybit = F_SIZE;
		break;
	case 't':
		if (strcmp(key, "time") == 0)
			keybit = F_TIME;
		else if (strcmp(key, "type") == 0)
			keybit = F_TYPE;
		break;
	case 'u':
		if (strcmp(key, "uid") == 0)
			keybit = F_UID;
		else if (strcmp(key, "uname") == 0)
			keybit = F_UNAME;
		else if (strcmp(key, "use-set") == 0) {
			mtree->output_global_set = (value != NULL)? 1: 0;
			return (ARCHIVE_OK);
		}
		break;
	}
	if (keybit != 0) {
		if (value != NULL)
			mtree->keys |= keybit;
		else
			mtree->keys &= ~keybit;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}